

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeLangevin.cpp
# Opt level: O0

void __thiscall
OpenMD::FluctuatingChargeLangevin::FluctuatingChargeLangevin
          (FluctuatingChargeLangevin *this,SimInfo *info)

{
  SnapshotManager *this_00;
  Snapshot *pSVar1;
  SimInfo *in_RSI;
  SimInfo *in_RDI;
  FluctuatingChargePropagator *in_stack_ffffffffffffffd0;
  int *piVar2;
  
  FluctuatingChargePropagator::FluctuatingChargePropagator(in_stack_ffffffffffffffd0,in_RDI);
  in_RDI->_vptr_SimInfo = (_func_int **)&PTR__FluctuatingChargeLangevin_00501e70;
  in_RDI->nBonds_ = 4;
  in_RDI->nBends_ = -0x5f4a1273;
  in_RDI->nTorsions_ = 0x3eb0c6f7;
  piVar2 = &in_RDI->nGlobalCutoffGroups_;
  this_00 = SimInfo::getSnapshotManager(in_RSI);
  pSVar1 = SnapshotManager::getCurrentSnapshot(this_00);
  *(Snapshot **)piVar2 = pSVar1;
  SimInfo::getRandomNumberGenerator((SimInfo *)&in_RDI->nGlobalRigidBodies_);
  std::normal_distribution<double>::normal_distribution((normal_distribution<double> *)0x396c15);
  return;
}

Assistant:

FluctuatingChargeLangevin::FluctuatingChargeLangevin(SimInfo* info) :
      FluctuatingChargePropagator(info), maxIterNum_(4), forceTolerance_(1e-6),
      snap_(info->getSnapshotManager()->getCurrentSnapshot()),
      randNumGen_(info->getRandomNumberGenerator()) {}